

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantUnion.h
# Opt level: O0

TConstUnion __thiscall glslang::TConstUnion::operator<<(TConstUnion *this,TConstUnion *constant)

{
  TConstUnion TVar1;
  TConstUnion *constant_local;
  TConstUnion *this_local;
  TConstUnion returnValue;
  
  TConstUnion((TConstUnion *)&this_local);
  switch(this->type) {
  case EbtInt8:
    switch(constant->type) {
    case EbtInt8:
      setI8Const((TConstUnion *)&this_local,
                 (char)((int)(this->field_0).i8Const << ((constant->field_0).u8Const & 0x1f)));
      break;
    case EbtUint8:
      setI8Const((TConstUnion *)&this_local,
                 (char)((int)(this->field_0).i8Const << ((constant->field_0).u8Const & 0x1f)));
      break;
    case EbtInt16:
      setI8Const((TConstUnion *)&this_local,
                 (char)((int)(this->field_0).i8Const << ((byte)(constant->field_0).u16Const & 0x1f))
                );
      break;
    case EbtUint16:
      setI8Const((TConstUnion *)&this_local,
                 (char)((int)(this->field_0).i8Const << ((byte)(constant->field_0).u16Const & 0x1f))
                );
      break;
    case EbtInt:
      setI8Const((TConstUnion *)&this_local,
                 (char)((int)(this->field_0).i8Const << ((byte)(constant->field_0).uConst & 0x1f)));
      break;
    case EbtUint:
      setI8Const((TConstUnion *)&this_local,
                 (char)((int)(this->field_0).i8Const << ((byte)(constant->field_0).uConst & 0x1f)));
      break;
    case EbtInt64:
      setI8Const((TConstUnion *)&this_local,
                 (char)((int)(this->field_0).i8Const << ((constant->field_0).u8Const & 0x1f)));
      break;
    case EbtUint64:
      setI8Const((TConstUnion *)&this_local,
                 (char)((int)(this->field_0).i8Const << ((constant->field_0).u8Const & 0x1f)));
      break;
    default:
      __assert_fail("false && \"Default missing\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                    ,0x285,"TConstUnion glslang::TConstUnion::operator<<(const TConstUnion &) const"
                   );
    }
    break;
  case EbtUint8:
    switch(constant->type) {
    case EbtInt8:
      setU8Const((TConstUnion *)&this_local,
                 (this->field_0).u8Const << ((constant->field_0).u8Const & 0x1f));
      break;
    case EbtUint8:
      setU8Const((TConstUnion *)&this_local,
                 (this->field_0).u8Const << ((constant->field_0).u8Const & 0x1f));
      break;
    case EbtInt16:
      setU8Const((TConstUnion *)&this_local,
                 (this->field_0).u8Const << ((byte)(constant->field_0).u16Const & 0x1f));
      break;
    case EbtUint16:
      setU8Const((TConstUnion *)&this_local,
                 (this->field_0).u8Const << ((byte)(constant->field_0).u16Const & 0x1f));
      break;
    case EbtInt:
      setU8Const((TConstUnion *)&this_local,
                 (this->field_0).u8Const << ((byte)(constant->field_0).uConst & 0x1f));
      break;
    case EbtUint:
      setU8Const((TConstUnion *)&this_local,
                 (this->field_0).u8Const << ((byte)(constant->field_0).uConst & 0x1f));
      break;
    case EbtInt64:
      setU8Const((TConstUnion *)&this_local,
                 (this->field_0).u8Const << ((constant->field_0).u8Const & 0x1f));
      break;
    case EbtUint64:
      setU8Const((TConstUnion *)&this_local,
                 (this->field_0).u8Const << ((constant->field_0).u8Const & 0x1f));
      break;
    default:
      __assert_fail("false && \"Default missing\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                    ,0x292,"TConstUnion glslang::TConstUnion::operator<<(const TConstUnion &) const"
                   );
    }
    break;
  case EbtInt16:
    switch(constant->type) {
    case EbtInt8:
      setI16Const((TConstUnion *)&this_local,
                  (short)((int)(this->field_0).i16Const << ((constant->field_0).u8Const & 0x1f)));
      break;
    case EbtUint8:
      setI16Const((TConstUnion *)&this_local,
                  (short)((int)(this->field_0).i16Const << ((constant->field_0).u8Const & 0x1f)));
      break;
    case EbtInt16:
      setI16Const((TConstUnion *)&this_local,
                  (short)((int)(this->field_0).i16Const <<
                         ((byte)(constant->field_0).u16Const & 0x1f)));
      break;
    case EbtUint16:
      setI16Const((TConstUnion *)&this_local,
                  (short)((int)(this->field_0).i16Const <<
                         ((byte)(constant->field_0).u16Const & 0x1f)));
      break;
    case EbtInt:
      setI16Const((TConstUnion *)&this_local,
                  (short)((int)(this->field_0).i16Const << ((byte)(constant->field_0).uConst & 0x1f)
                         ));
      break;
    case EbtUint:
      setI16Const((TConstUnion *)&this_local,
                  (short)((int)(this->field_0).i16Const << ((byte)(constant->field_0).uConst & 0x1f)
                         ));
      break;
    case EbtInt64:
      setI16Const((TConstUnion *)&this_local,
                  (short)((int)(this->field_0).i16Const << ((constant->field_0).u8Const & 0x1f)));
      break;
    case EbtUint64:
      setI16Const((TConstUnion *)&this_local,
                  (short)((int)(this->field_0).i16Const << ((constant->field_0).u8Const & 0x1f)));
      break;
    default:
      __assert_fail("false && \"Default missing\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                    ,0x29f,"TConstUnion glslang::TConstUnion::operator<<(const TConstUnion &) const"
                   );
    }
    break;
  case EbtUint16:
    switch(constant->type) {
    case EbtInt8:
      setU16Const((TConstUnion *)&this_local,
                  (this->field_0).u16Const << ((constant->field_0).u8Const & 0x1f));
      break;
    case EbtUint8:
      setU16Const((TConstUnion *)&this_local,
                  (this->field_0).u16Const << ((constant->field_0).u8Const & 0x1f));
      break;
    case EbtInt16:
      setU16Const((TConstUnion *)&this_local,
                  (this->field_0).u16Const << ((byte)(constant->field_0).u16Const & 0x1f));
      break;
    case EbtUint16:
      setU16Const((TConstUnion *)&this_local,
                  (this->field_0).u16Const << ((byte)(constant->field_0).u16Const & 0x1f));
      break;
    case EbtInt:
      setU16Const((TConstUnion *)&this_local,
                  (this->field_0).u16Const << ((byte)(constant->field_0).uConst & 0x1f));
      break;
    case EbtUint:
      setU16Const((TConstUnion *)&this_local,
                  (this->field_0).u16Const << ((byte)(constant->field_0).uConst & 0x1f));
      break;
    case EbtInt64:
      setU16Const((TConstUnion *)&this_local,
                  (this->field_0).u16Const << ((constant->field_0).u8Const & 0x1f));
      break;
    case EbtUint64:
      setU16Const((TConstUnion *)&this_local,
                  (this->field_0).u16Const << ((constant->field_0).u8Const & 0x1f));
      break;
    default:
      __assert_fail("false && \"Default missing\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                    ,0x2ac,"TConstUnion glslang::TConstUnion::operator<<(const TConstUnion &) const"
                   );
    }
    break;
  case EbtInt:
    switch(constant->type) {
    case EbtInt8:
      setIConst((TConstUnion *)&this_local,
                (this->field_0).uConst << ((constant->field_0).u8Const & 0x1f));
      break;
    case EbtUint8:
      setIConst((TConstUnion *)&this_local,
                (this->field_0).uConst << ((constant->field_0).u8Const & 0x1f));
      break;
    case EbtInt16:
      setIConst((TConstUnion *)&this_local,
                (this->field_0).uConst << ((byte)(constant->field_0).u16Const & 0x1f));
      break;
    case EbtUint16:
      setIConst((TConstUnion *)&this_local,
                (this->field_0).uConst << ((byte)(constant->field_0).u16Const & 0x1f));
      break;
    case EbtInt:
      setIConst((TConstUnion *)&this_local,
                (this->field_0).uConst << ((byte)(constant->field_0).uConst & 0x1f));
      break;
    case EbtUint:
      setIConst((TConstUnion *)&this_local,
                (this->field_0).uConst << ((byte)(constant->field_0).uConst & 0x1f));
      break;
    case EbtInt64:
      setIConst((TConstUnion *)&this_local,
                (this->field_0).uConst << ((constant->field_0).u8Const & 0x1f));
      break;
    case EbtUint64:
      setIConst((TConstUnion *)&this_local,
                (this->field_0).uConst << ((constant->field_0).u8Const & 0x1f));
      break;
    default:
      __assert_fail("false && \"Default missing\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                    ,0x2d3,"TConstUnion glslang::TConstUnion::operator<<(const TConstUnion &) const"
                   );
    }
    break;
  case EbtUint:
    switch(constant->type) {
    case EbtInt8:
      setUConst((TConstUnion *)&this_local,
                (this->field_0).uConst << ((constant->field_0).u8Const & 0x1f));
      break;
    case EbtUint8:
      setUConst((TConstUnion *)&this_local,
                (this->field_0).uConst << ((constant->field_0).u8Const & 0x1f));
      break;
    case EbtInt16:
      setUConst((TConstUnion *)&this_local,
                (this->field_0).uConst << ((byte)(constant->field_0).u16Const & 0x1f));
      break;
    case EbtUint16:
      setUConst((TConstUnion *)&this_local,
                (this->field_0).uConst << ((byte)(constant->field_0).u16Const & 0x1f));
      break;
    case EbtInt:
      setUConst((TConstUnion *)&this_local,
                (this->field_0).uConst << ((byte)(constant->field_0).uConst & 0x1f));
      break;
    case EbtUint:
      setUConst((TConstUnion *)&this_local,
                (this->field_0).uConst << ((byte)(constant->field_0).uConst & 0x1f));
      break;
    case EbtInt64:
      setUConst((TConstUnion *)&this_local,
                (this->field_0).uConst << ((constant->field_0).u8Const & 0x1f));
      break;
    case EbtUint64:
      setUConst((TConstUnion *)&this_local,
                (this->field_0).uConst << ((constant->field_0).u8Const & 0x1f));
      break;
    default:
      __assert_fail("false && \"Default missing\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                    ,0x2e0,"TConstUnion glslang::TConstUnion::operator<<(const TConstUnion &) const"
                   );
    }
    break;
  case EbtInt64:
    switch(constant->type) {
    case EbtInt8:
      setI64Const((TConstUnion *)&this_local,
                  (this->field_0).u64Const << ((constant->field_0).u8Const & 0x3f));
      break;
    case EbtUint8:
      setI64Const((TConstUnion *)&this_local,
                  (this->field_0).u64Const << ((constant->field_0).u8Const & 0x3f));
      break;
    case EbtInt16:
      setI64Const((TConstUnion *)&this_local,
                  (this->field_0).u64Const << ((byte)(constant->field_0).u16Const & 0x3f));
      break;
    case EbtUint16:
      setI64Const((TConstUnion *)&this_local,
                  (this->field_0).u64Const << ((byte)(constant->field_0).u16Const & 0x3f));
      break;
    case EbtInt:
      setI64Const((TConstUnion *)&this_local,
                  (this->field_0).u64Const << ((byte)(constant->field_0).uConst & 0x3f));
      break;
    case EbtUint:
      setI64Const((TConstUnion *)&this_local,
                  (this->field_0).u64Const << ((byte)(constant->field_0).uConst & 0x3f));
      break;
    case EbtInt64:
      setI64Const((TConstUnion *)&this_local,
                  (this->field_0).u64Const << ((constant->field_0).u8Const & 0x3f));
      break;
    case EbtUint64:
      setI64Const((TConstUnion *)&this_local,
                  (this->field_0).u64Const << ((constant->field_0).u8Const & 0x3f));
      break;
    default:
      __assert_fail("false && \"Default missing\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                    ,0x2b9,"TConstUnion glslang::TConstUnion::operator<<(const TConstUnion &) const"
                   );
    }
    break;
  case EbtUint64:
    switch(constant->type) {
    case EbtInt8:
      setU64Const((TConstUnion *)&this_local,
                  (this->field_0).u64Const << ((constant->field_0).u8Const & 0x3f));
      break;
    case EbtUint8:
      setU64Const((TConstUnion *)&this_local,
                  (this->field_0).u64Const << ((constant->field_0).u8Const & 0x3f));
      break;
    case EbtInt16:
      setU64Const((TConstUnion *)&this_local,
                  (this->field_0).u64Const << ((byte)(constant->field_0).u16Const & 0x3f));
      break;
    case EbtUint16:
      setU64Const((TConstUnion *)&this_local,
                  (this->field_0).u64Const << ((byte)(constant->field_0).u16Const & 0x3f));
      break;
    case EbtInt:
      setU64Const((TConstUnion *)&this_local,
                  (this->field_0).u64Const << ((byte)(constant->field_0).uConst & 0x3f));
      break;
    case EbtUint:
      setU64Const((TConstUnion *)&this_local,
                  (this->field_0).u64Const << ((byte)(constant->field_0).uConst & 0x3f));
      break;
    case EbtInt64:
      setU64Const((TConstUnion *)&this_local,
                  (this->field_0).u64Const << ((constant->field_0).u8Const & 0x3f));
      break;
    case EbtUint64:
      setU64Const((TConstUnion *)&this_local,
                  (this->field_0).u64Const << ((constant->field_0).u8Const & 0x3f));
      break;
    default:
      __assert_fail("false && \"Default missing\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                    ,0x2c6,"TConstUnion glslang::TConstUnion::operator<<(const TConstUnion &) const"
                   );
    }
    break;
  default:
    __assert_fail("false && \"Default missing\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                  ,0x2e3,"TConstUnion glslang::TConstUnion::operator<<(const TConstUnion &) const");
  }
  TVar1._12_4_ = 0;
  TVar1.field_0 = (anon_union_8_11_a9b10978_for_TConstUnion_0)this_local;
  TVar1.type = returnValue.field_0._0_4_;
  return TVar1;
}

Assistant:

TConstUnion operator<<(const TConstUnion& constant) const
    {
        TConstUnion returnValue;
        switch (type) {
        case EbtInt8:
            switch (constant.type) {
            case EbtInt8:   returnValue.setI8Const(i8Const << constant.i8Const);  break;
            case EbtUint8:  returnValue.setI8Const(i8Const << constant.u8Const);  break;
            case EbtInt16:  returnValue.setI8Const(i8Const << constant.i16Const); break;
            case EbtUint16: returnValue.setI8Const(i8Const << constant.u16Const); break;
            case EbtInt:    returnValue.setI8Const(i8Const << constant.iConst);   break;
            case EbtUint:   returnValue.setI8Const(i8Const << constant.uConst);   break;
            case EbtInt64:  returnValue.setI8Const(i8Const << constant.i64Const); break;
            case EbtUint64: returnValue.setI8Const(i8Const << constant.u64Const); break;
            default:       assert(false && "Default missing");
            }
            break;
        case EbtUint8:
            switch (constant.type) {
            case EbtInt8:   returnValue.setU8Const(u8Const << constant.i8Const);  break;
            case EbtUint8:  returnValue.setU8Const(u8Const << constant.u8Const);  break;
            case EbtInt16:  returnValue.setU8Const(u8Const << constant.i16Const); break;
            case EbtUint16: returnValue.setU8Const(u8Const << constant.u16Const); break;
            case EbtInt:    returnValue.setU8Const(u8Const << constant.iConst);   break;
            case EbtUint:   returnValue.setU8Const(u8Const << constant.uConst);   break;
            case EbtInt64:  returnValue.setU8Const(u8Const << constant.i64Const); break;
            case EbtUint64: returnValue.setU8Const(u8Const << constant.u64Const); break;
            default:       assert(false && "Default missing");
            }
            break;
        case EbtInt16:
            switch (constant.type) {
            case EbtInt8:   returnValue.setI16Const(i16Const << constant.i8Const);  break;
            case EbtUint8:  returnValue.setI16Const(i16Const << constant.u8Const);  break;
            case EbtInt16:  returnValue.setI16Const(i16Const << constant.i16Const); break;
            case EbtUint16: returnValue.setI16Const(i16Const << constant.u16Const); break;
            case EbtInt:    returnValue.setI16Const(i16Const << constant.iConst);   break;
            case EbtUint:   returnValue.setI16Const(i16Const << constant.uConst);   break;
            case EbtInt64:  returnValue.setI16Const(i16Const << constant.i64Const); break;
            case EbtUint64: returnValue.setI16Const(i16Const << constant.u64Const); break;
            default:       assert(false && "Default missing");
            }
            break;
        case EbtUint16:
            switch (constant.type) {
            case EbtInt8:   returnValue.setU16Const(u16Const << constant.i8Const);  break;
            case EbtUint8:  returnValue.setU16Const(u16Const << constant.u8Const);  break;
            case EbtInt16:  returnValue.setU16Const(u16Const << constant.i16Const); break;
            case EbtUint16: returnValue.setU16Const(u16Const << constant.u16Const); break;
            case EbtInt:    returnValue.setU16Const(u16Const << constant.iConst);   break;
            case EbtUint:   returnValue.setU16Const(u16Const << constant.uConst);   break;
            case EbtInt64:  returnValue.setU16Const(u16Const << constant.i64Const); break;
            case EbtUint64: returnValue.setU16Const(u16Const << constant.u64Const); break;
            default:       assert(false && "Default missing");
            }
            break;
         case EbtInt64:
            switch (constant.type) {
            case EbtInt8:   returnValue.setI64Const(i64Const << constant.i8Const);  break;
            case EbtUint8:  returnValue.setI64Const(i64Const << constant.u8Const);  break;
            case EbtInt16:  returnValue.setI64Const(i64Const << constant.i16Const); break;
            case EbtUint16: returnValue.setI64Const(i64Const << constant.u16Const); break;
            case EbtInt:    returnValue.setI64Const(i64Const << constant.iConst);   break;
            case EbtUint:   returnValue.setI64Const(i64Const << constant.uConst);   break;
            case EbtInt64:  returnValue.setI64Const(i64Const << constant.i64Const); break;
            case EbtUint64: returnValue.setI64Const(i64Const << constant.u64Const); break;
            default:       assert(false && "Default missing");
            }
            break;
        case EbtUint64:
            switch (constant.type) {
            case EbtInt8:   returnValue.setU64Const(u64Const << constant.i8Const);  break;
            case EbtUint8:  returnValue.setU64Const(u64Const << constant.u8Const);  break;
            case EbtInt16:  returnValue.setU64Const(u64Const << constant.i16Const); break;
            case EbtUint16: returnValue.setU64Const(u64Const << constant.u16Const); break;
            case EbtInt:    returnValue.setU64Const(u64Const << constant.iConst);   break;
            case EbtUint:   returnValue.setU64Const(u64Const << constant.uConst);   break;
            case EbtInt64:  returnValue.setU64Const(u64Const << constant.i64Const); break;
            case EbtUint64: returnValue.setU64Const(u64Const << constant.u64Const); break;
            default:       assert(false && "Default missing");
            }
            break;
        case EbtInt:
            switch (constant.type) {
            case EbtInt:    returnValue.setIConst(iConst << constant.iConst);   break;
            case EbtUint:   returnValue.setIConst(iConst << constant.uConst);   break;
            case EbtInt8:   returnValue.setIConst(iConst << constant.i8Const);  break;
            case EbtUint8:  returnValue.setIConst(iConst << constant.u8Const);  break;
            case EbtInt16:  returnValue.setIConst(iConst << constant.i16Const); break;
            case EbtUint16: returnValue.setIConst(iConst << constant.u16Const); break;
            case EbtInt64:  returnValue.setIConst(iConst << constant.i64Const); break;
            case EbtUint64: returnValue.setIConst(iConst << constant.u64Const); break;
            default:       assert(false && "Default missing");
            }
            break;
        case EbtUint:
            switch (constant.type) {
            case EbtInt:    returnValue.setUConst(uConst << constant.iConst);   break;
            case EbtUint:   returnValue.setUConst(uConst << constant.uConst);   break;
            case EbtInt8:   returnValue.setUConst(uConst << constant.i8Const);  break;
            case EbtUint8:  returnValue.setUConst(uConst << constant.u8Const);  break;
            case EbtInt16:  returnValue.setUConst(uConst << constant.i16Const); break;
            case EbtUint16: returnValue.setUConst(uConst << constant.u16Const); break;
            case EbtInt64:  returnValue.setUConst(uConst << constant.i64Const); break;
            case EbtUint64: returnValue.setUConst(uConst << constant.u64Const); break;
            default:       assert(false && "Default missing");
            }
            break;
        default:     assert(false && "Default missing");
        }

        return returnValue;
    }